

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O2

void * worker_thread_get_unique_keys(void *arg)

{
  FILE *__stream;
  long lVar1;
  undefined8 uVar2;
  uint i;
  ulong uVar3;
  undefined1 local_148 [8];
  char vbuf [256];
  long local_40;
  unsigned_long_long key;
  size_t vsize;
  
  key = 0;
  uVar3 = 0;
  do {
    if (*(uint *)((long)arg + 0x1c) <= uVar3) {
      return (void *)0x0;
    }
    local_40 = ((ulong)*arg << 0x30) + uVar3;
    lVar1 = vmemcache_get(*(undefined8 *)((long)arg + 8),&local_40,8,local_148,0x100,0,&key);
    uVar3 = uVar3 + 1;
  } while (lVar1 != -1);
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
          ,0x14c,"worker_thread_get_unique_keys");
  __stream = _stderr;
  uVar2 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_get: %s",uVar2);
  fputc(10,_stderr);
  abort();
}

Assistant:

static void *
worker_thread_get_unique_keys(void *arg)
{
	struct context *ctx = arg;
	unsigned long long key;

	char vbuf[BUF_SIZE];		/* user-provided buffer */
	size_t vbufsize = BUF_SIZE;	/* size of vbuf */
	size_t vsize = 0;		/* real size of the object */

	for (unsigned i = 0; i < ctx->ops_count; i++) {
		key = ((unsigned long long)ctx->thread_number << 48) | i;
		if (vmemcache_get(ctx->cache, &key, sizeof(key),
					vbuf, vbufsize, 0, &vsize) == -1)
			UT_FATAL("ERROR: vmemcache_get: %s",
					vmemcache_errormsg());
	}

	return NULL;
}